

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O0

void amrex_mempool_get_stats(int *mp_min,int *mp_max,int *mp_tot)

{
  bool bVar1;
  pointer this;
  unsigned_long *puVar2;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  size_t hsu;
  unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_> *mp;
  iterator __end1;
  iterator __begin1;
  Vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
  *__range1;
  size_t hsu_tot;
  size_t hsu_max;
  size_t hsu_min;
  vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_*,_std::vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_*,_std::vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>_>
  local_40;
  undefined1 *local_38;
  ulong local_30;
  unsigned_long local_28;
  unsigned_long local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  undefined4 *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = std::numeric_limits<unsigned_long>::max();
  local_28 = 0;
  local_30 = 0;
  local_38 = (anonymous_namespace)::the_memory_pool;
  local_40._M_current =
       (unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_> *)
       std::
       vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  std::
  vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
  ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_*,_std::vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    in_stack_ffffffffffffffb0 =
         (__normal_iterator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_*,_std::vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>_>
          *)__gnu_cxx::
            __normal_iterator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_*,_std::vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>_>
            ::operator*(&local_40);
    this = std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>::operator->
                     ((unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_> *)0x104fb4b);
    in_stack_ffffffffffffffa8 =
         (vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
          *)amrex::CArena::heap_space_used(this);
    puVar2 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffa8,&local_20);
    local_20 = *puVar2;
    puVar2 = std::max<unsigned_long>((unsigned_long *)&stack0xffffffffffffffa8,&local_28);
    local_28 = *puVar2;
    local_30 = (long)&(in_stack_ffffffffffffffa8->
                      super__Vector_base<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + local_30;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_*,_std::vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>_>
    ::operator++(&local_40);
  }
  *local_8 = (int)(local_20 >> 0x14);
  *local_10 = (int)(local_28 >> 0x14);
  *local_18 = (int)(local_30 >> 0x14);
  return;
}

Assistant:

void amrex_mempool_get_stats (int& mp_min, int& mp_max, int& mp_tot) // min, max & tot in MB
{
  size_t hsu_min=std::numeric_limits<size_t>::max();
  size_t hsu_max=0;
  size_t hsu_tot=0;
  for (const auto& mp : the_memory_pool) {
    size_t hsu = mp->heap_space_used();
    hsu_min = std::min(hsu, hsu_min);
    hsu_max = std::max(hsu, hsu_max);
    hsu_tot += hsu;
  }
  mp_min = hsu_min/(1024*1024);
  mp_max = hsu_max/(1024*1024);
  mp_tot = hsu_tot/(1024*1024);
}